

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O1

int run_test_close_order(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *loop;
  uv_handle_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_38 [16];
  uv_close_cb local_28;
  uv_close_cb local_20;
  
  auStack_38._8_8_ = (uv_loop_t *)0x17fbca;
  loop = uv_default_loop();
  auStack_38._8_8_ = (uv_loop_t *)0x17fbdf;
  uv_check_init(loop,&check_handle);
  auStack_38._8_8_ = (uv_loop_t *)0x17fbee;
  uv_check_start(&check_handle,check_cb);
  auStack_38._8_8_ = (uv_loop_t *)0x17fc00;
  uv_timer_init(loop,&timer_handle1);
  auStack_38._8_8_ = (uv_loop_t *)0x17fc16;
  uv_timer_start(&timer_handle1,timer_cb,0,0);
  auStack_38._8_8_ = (uv_loop_t *)0x17fc28;
  uv_timer_init(loop,&timer_handle2);
  auStack_38._8_8_ = (uv_loop_t *)0x17fc3a;
  uv_timer_start(&timer_handle2,timer_cb,100000,0);
  local_20 = (uv_close_cb)(long)check_cb_called;
  local_28 = (uv_close_cb)0x0;
  if (local_20 == (uv_close_cb)0x0) {
    local_20 = (uv_close_cb)(long)close_cb_called;
    local_28 = (uv_close_cb)0x0;
    if (local_20 != (uv_close_cb)0x0) goto LAB_0017fd71;
    local_20 = (uv_close_cb)(long)timer_cb_called;
    local_28 = (uv_close_cb)0x0;
    if (local_20 != (uv_close_cb)0x0) goto LAB_0017fd7e;
    auStack_38._8_8_ = (uv_loop_t *)0x17fcad;
    uv_run(loop,UV_RUN_DEFAULT);
    local_20 = (uv_close_cb)0x1;
    local_28 = (uv_close_cb)(long)check_cb_called;
    if (local_28 != (uv_close_cb)0x1) goto LAB_0017fd8b;
    local_20 = (uv_close_cb)0x3;
    local_28 = (uv_close_cb)(long)close_cb_called;
    if (local_28 != (uv_close_cb)0x3) goto LAB_0017fd98;
    local_20 = (uv_close_cb)0x1;
    local_28 = (uv_close_cb)(long)timer_cb_called;
    if (local_28 != (uv_close_cb)0x1) goto LAB_0017fda5;
    auStack_38._8_8_ = (uv_loop_t *)0x17fd27;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStack_38._8_8_ = (uv_loop_t *)0x17fd31;
    uv_run(loop,UV_RUN_DEFAULT);
    local_20 = (uv_close_cb)0x0;
    auStack_38._8_8_ = (uv_loop_t *)0x17fd42;
    iVar1 = uv_loop_close(loop);
    local_28 = (uv_close_cb)(long)iVar1;
    if (local_20 == local_28) {
      auStack_38._8_8_ = (uv_loop_t *)0x17fd58;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_38._8_8_ = (uv_loop_t *)0x17fd71;
    run_test_close_order_cold_1();
LAB_0017fd71:
    auStack_38._8_8_ = (uv_loop_t *)0x17fd7e;
    run_test_close_order_cold_2();
LAB_0017fd7e:
    auStack_38._8_8_ = (uv_loop_t *)0x17fd8b;
    run_test_close_order_cold_3();
LAB_0017fd8b:
    auStack_38._8_8_ = (uv_loop_t *)0x17fd98;
    run_test_close_order_cold_4();
LAB_0017fd98:
    auStack_38._8_8_ = (uv_loop_t *)0x17fda5;
    run_test_close_order_cold_5();
LAB_0017fda5:
    auStack_38._8_8_ = (uv_loop_t *)0x17fdb2;
    run_test_close_order_cold_6();
  }
  puVar2 = (uv_handle_t *)&stack0xffffffffffffffe0;
  auStack_38._8_8_ = check_cb;
  run_test_close_order_cold_7();
  auStack_38._0_8_ = (void *)0x0;
  auStack_38._8_8_ = loop;
  if (check_cb_called == 0) {
    auStack_38._0_8_ = (void *)0x0;
    if (timer_cb_called == 0) {
      auStack_38._0_8_ = (void *)0x0;
      if (close_cb_called == 0) {
        uv_close(puVar2,close_cb);
        uv_close((uv_handle_t *)&timer_handle2,close_cb);
        check_cb_called = check_cb_called + 1;
        return extraout_EAX;
      }
      goto LAB_0017fe65;
    }
  }
  else {
    check_cb_cold_1();
  }
  check_cb_cold_2();
LAB_0017fe65:
  puVar2 = (uv_handle_t *)auStack_38;
  check_cb_cold_3();
  uv_close(puVar2,close_cb);
  timer_cb_called = timer_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(close_order) {
  uv_loop_t* loop;
  loop = uv_default_loop();

  uv_check_init(loop, &check_handle);
  uv_check_start(&check_handle, check_cb);
  uv_timer_init(loop, &timer_handle1);
  uv_timer_start(&timer_handle1, timer_cb, 0, 0);
  uv_timer_init(loop, &timer_handle2);
  uv_timer_start(&timer_handle2, timer_cb, 100000, 0);

  ASSERT_OK(check_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(timer_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}